

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

Expression * __thiscall wasm::TranslateToFuzzReader::makeMemoryCopy(TranslateToFuzzReader *this)

{
  string_view destMemory;
  Expression *dest_00;
  Expression *source_00;
  reference pvVar1;
  pointer pMVar2;
  Expression *size_00;
  Expression *size;
  Expression *source;
  Expression *dest;
  TranslateToFuzzReader *local_18;
  TranslateToFuzzReader *this_local;
  
  local_18 = this;
  if ((this->allowMemory & 1U) == 0) {
    Type::Type((Type *)&dest,none);
    this_local = (TranslateToFuzzReader *)makeTrivial(this,(Type)dest);
  }
  else {
    dest_00 = makePointer(this);
    source_00 = makePointer(this);
    pvVar1 = std::
             vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
             ::operator[]((vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                           *)(this->wasm + 0x78),0);
    pMVar2 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->(pvVar1);
    size_00 = make(this,(Type)(pMVar2->addressType).id);
    pvVar1 = std::
             vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
             ::operator[]((vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                           *)(this->wasm + 0x78),0);
    pMVar2 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->(pvVar1);
    destMemory = (pMVar2->super_Importable).super_Named.name.super_IString.str;
    pvVar1 = std::
             vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
             ::operator[]((vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                           *)(this->wasm + 0x78),0);
    pMVar2 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->(pvVar1);
    this_local = (TranslateToFuzzReader *)
                 Builder::makeMemoryCopy
                           (&this->builder,dest_00,source_00,size_00,(Name)destMemory,
                            (Name)(pMVar2->super_Importable).super_Named.name.super_IString.str);
  }
  return (Expression *)this_local;
}

Assistant:

Expression* TranslateToFuzzReader::makeMemoryCopy() {
  if (!allowMemory) {
    return makeTrivial(Type::none);
  }
  Expression* dest = makePointer();
  Expression* source = makePointer();
  Expression* size = make(wasm.memories[0]->addressType);
  return builder.makeMemoryCopy(
    dest, source, size, wasm.memories[0]->name, wasm.memories[0]->name);
}